

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineTimestampTests.cpp
# Opt level: O3

string * __thiscall
vkt::pipeline::(anonymous_namespace)::TransferTimestampTestParam::generateTestDescription_abi_cxx11_
          (string *__return_storage_ptr__,void *this)

{
  long *plVar1;
  uint *puVar2;
  undefined1 isDescription;
  long *in_RCX;
  long *plVar3;
  uint *puVar4;
  long *plVar5;
  long *local_78;
  long local_68;
  long lStack_60;
  string local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_38;
  
  local_38 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_38;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  isDescription = SUB81(in_RCX,0);
  puVar4 = *(uint **)((long)this + 8);
  puVar2 = *(uint **)((long)this + 0x10);
  if (puVar4 != puVar2) {
    do {
      if (*puVar4 != 1) {
        getPipelineStageFlagStr_abi_cxx11_
                  (&local_58,(_anonymous_namespace_ *)(ulong)*puVar4,
                   VK_PIPELINE_STAGE_TOP_OF_PIPE_BIT,SUB81(in_RCX,0));
        plVar1 = (long *)std::__cxx11::string::_M_replace_aux
                                   ((ulong)&local_58,local_58._M_string_length,0,'\x01');
        in_RCX = plVar1 + 2;
        if ((long *)*plVar1 == in_RCX) {
          local_68 = *in_RCX;
          lStack_60 = plVar1[3];
          local_78 = &local_68;
        }
        else {
          local_68 = *in_RCX;
          local_78 = (long *)*plVar1;
        }
        *plVar1 = (long)in_RCX;
        plVar1[1] = 0;
        *(undefined1 *)(plVar1 + 2) = 0;
        std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_78);
        if (local_78 != &local_68) {
          operator_delete(local_78,local_68 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p != &local_58.field_2) {
          operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
        }
        puVar2 = *(uint **)((long)this + 0x10);
      }
      isDescription = SUB81(in_RCX,0);
      puVar4 = puVar4 + 1;
    } while (puVar4 != puVar2);
  }
  getTransferMethodStr_abi_cxx11_
            (&local_58,(_anonymous_namespace_ *)(ulong)*(uint *)((long)this + 0x24),
             TRANSFER_METHOD_COPY_IMAGE,(bool)isDescription);
  plVar1 = (long *)std::__cxx11::string::replace((ulong)&local_58,0,(char *)0x0,0xaf8f91);
  plVar3 = plVar1 + 2;
  if ((long *)*plVar1 == plVar3) {
    local_68 = *plVar3;
    lStack_60 = plVar1[3];
    plVar5 = &local_68;
  }
  else {
    local_68 = *plVar3;
    plVar5 = (long *)*plVar1;
  }
  *plVar1 = (long)plVar3;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)plVar5);
  if (plVar5 != &local_68) {
    operator_delete(plVar5,local_68 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

const std::string TransferTimestampTestParam::generateTestDescription(void) const
{
	std::string result("");

	for (StageFlagVector::const_iterator it = m_stageVec.begin(); it != m_stageVec.end(); it++)
	{
		if(*it != VK_PIPELINE_STAGE_TOP_OF_PIPE_BIT)
		{
			result += getPipelineStageFlagStr(*it, true) + ' ';
		}
	}

	result += "with " + getTransferMethodStr(m_method, true);

	return result;

}